

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::setIntegrator
          (MultipleShootingTranscription *this,
          shared_ptr<iDynTree::optimalcontrol::integrators::Integrator> *integrationMethod)

{
  element_type *peVar1;
  char *pcVar2;
  
  peVar1 = (integrationMethod->
           super___shared_ptr<iDynTree::optimalcontrol::integrators::Integrator,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    pcVar2 = "Empty pointer.";
  }
  else {
    if ((this->m_integrator).
        super___shared_ptr<iDynTree::optimalcontrol::integrators::Integrator,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      (this->m_integrator).
      super___shared_ptr<iDynTree::optimalcontrol::integrators::Integrator,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_integrator).
                  super___shared_ptr<iDynTree::optimalcontrol::integrators::Integrator,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 &(integrationMethod->
                  super___shared_ptr<iDynTree::optimalcontrol::integrators::Integrator,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount);
      return true;
    }
    pcVar2 = "The integration method for this instance has already been set.";
  }
  iDynTree::reportError("MultipleShootingSolver","setIntegrator",pcVar2);
  return false;
}

Assistant:

bool setIntegrator(const std::shared_ptr<Integrator> integrationMethod) {
                if (!(integrationMethod)) {
                    reportError("MultipleShootingSolver", "setIntegrator", "Empty pointer.");
                    return false;
                }

                if (m_integrator){
                    reportError("MultipleShootingSolver", "setIntegrator", "The integration method for this instance has already been set.");
                    return false;
                }

                m_integrator = integrationMethod;
                return true;
            }